

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O3

int cmd_searchpath(char *arg)

{
  char cVar1;
  long lVar2;
  int iVar3;
  char *__s1;
  long *plVar4;
  undefined1 local_b8 [8];
  stat st;
  
  __s1 = strchr(arg,0x20);
  if (__s1 != (char *)0x0) {
    for (; cVar1 = *__s1, cVar1 == ' '; __s1 = __s1 + 1) {
    }
    if (cVar1 != '\0') {
      if ((((cVar1 == '-') && (__s1[1] == 'h')) && ((__s1[2] & 0xdfU) == 0)) ||
         ((iVar3 = strncmp(__s1,"--help",6), iVar3 == 0 && ((__s1[6] & 0xdfU) == 0)))) {
        cmd_searchpath_help();
      }
      else {
        iVar3 = strncmp(__s1,"--clear",7);
        if ((iVar3 != 0) || ((__s1[7] & 0xdfU) != 0)) {
          iVar3 = stat(__s1,(stat *)local_b8);
          if (iVar3 == -1) {
            cmd_searchpath_cold_1();
          }
          else {
            if (((uint)st.st_nlink & 0xf000) == 0x4000) {
              ly_ctx_set_searchdir(ctx,__s1);
              return 0;
            }
            fprintf(_stderr,"\"%s\" is not a directory.\n",__s1);
          }
          return 1;
        }
        ly_ctx_unset_searchdirs(ctx,0xffffffff);
      }
      return 0;
    }
  }
  plVar4 = (long *)ly_ctx_get_searchdirs(ctx);
  if (plVar4 != (long *)0x0) {
    lVar2 = *plVar4;
    while (lVar2 != 0) {
      plVar4 = plVar4 + 1;
      fprintf(_stdout,"%s\n");
      lVar2 = *plVar4;
    }
  }
  return 0;
}

Assistant:

int
cmd_searchpath(const char *arg)
{
    const char *path;
    const char * const *searchpaths;
    int index;
    struct stat st;

    for (path = strchr(arg, ' '); path && (path[0] == ' '); ++path);
    if (!path || (path[0] == '\0')) {
        searchpaths = ly_ctx_get_searchdirs(ctx);
        if (searchpaths) {
            for (index = 0; searchpaths[index]; index++) {
                fprintf(stdout, "%s\n", searchpaths[index]);
            }
        }
        return 0;
    }

    if ((!strncmp(path, "-h", 2) && (path[2] == '\0' || path[2] == ' ')) ||
        (!strncmp(path, "--help", 6) && (path[6] == '\0' || path[6] == ' '))) {
        cmd_searchpath_help();
        return 0;
    } else if (!strncmp(path, "--clear", 7) && (path[7] == '\0' || path[7] == ' ')) {
        ly_ctx_unset_searchdirs(ctx, -1);
        return 0;
    }

    if (stat(path, &st) == -1) {
        fprintf(stderr, "Failed to stat the search path (%s).\n", strerror(errno));
        return 1;
    }
    if (!S_ISDIR(st.st_mode)) {
        fprintf(stderr, "\"%s\" is not a directory.\n", path);
        return 1;
    }

    ly_ctx_set_searchdir(ctx, path);

    return 0;
}